

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O3

string * pybind11::type_id<pybind11::object>(void)

{
  string *extraout_RAX;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"N8pybind116objectE","");
  detail::clean_type_id(in_RDI);
  return extraout_RAX;
}

Assistant:

static std::string type_id() {
    return detail::clean_type_id(typeid(T).name());
}